

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void I422ToRGB24Row_C(uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *rgb_buf,
                     YuvConstants *yuvconstants,int width)

{
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  uint in_R9D;
  uint8_t unaff_retaddr;
  uint8_t unaff_retaddr_00;
  uint8_t unaff_retaddr_01;
  int x;
  int local_30;
  
  for (local_30 = 0; local_30 < (int)(in_R9D - 1); local_30 = local_30 + 2) {
    libyuv::YuvPixel(unaff_retaddr_01,unaff_retaddr_00,unaff_retaddr,in_RDI,in_RSI,in_RDX,
                     yuvconstants);
    libyuv::YuvPixel(unaff_retaddr_01,unaff_retaddr_00,unaff_retaddr,in_RDI,in_RSI,in_RDX,
                     yuvconstants);
    in_RDI = in_RDI + 2;
    in_RSI = in_RSI + 1;
    in_RDX = in_RDX + 1;
  }
  if ((in_R9D & 1) != 0) {
    libyuv::YuvPixel(unaff_retaddr_01,unaff_retaddr_00,unaff_retaddr,in_RDI,in_RSI,in_RDX,
                     yuvconstants);
  }
  return;
}

Assistant:

void I422ToRGB24Row_C(const uint8_t* src_y,
                      const uint8_t* src_u,
                      const uint8_t* src_v,
                      uint8_t* rgb_buf,
                      const struct YuvConstants* yuvconstants,
                      int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel(src_y[0], src_u[0], src_v[0], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
    YuvPixel(src_y[1], src_u[0], src_v[0], rgb_buf + 3, rgb_buf + 4,
             rgb_buf + 5, yuvconstants);
    src_y += 2;
    src_u += 1;
    src_v += 1;
    rgb_buf += 6;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel(src_y[0], src_u[0], src_v[0], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
  }
}